

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::
join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[37],std::__cxx11::string&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
          (spirv_cross *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
          char (*ts_1) [2],uint *ts_2,char (*ts_3) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [37],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_6,char (*ts_7) [3],
          uint *ts_8,char (*ts_9) [3])

{
  undefined1 local_1140 [8];
  StringStream<4096UL,_4096UL> stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_4;
  char (*ts_local_3) [3];
  uint *ts_local_2;
  char (*ts_local_1) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_4;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1140);
  inner::
  join_helper<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[37],std::__cxx11::string&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
            ((StringStream<4096UL,_4096UL> *)local_1140,ts,ts_1,ts_2,ts_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stream.saved_buffers.stack_storage.aligned_char._184_8_,ts_5,ts_6,ts_7,ts_8,ts_9);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1140);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}